

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall StringLiteralNode::~StringLiteralNode(StringLiteralNode *this)

{
  ~StringLiteralNode(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

StringLiteralNode(const std::string& value): value_(value) {}